

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceBindingBase.hpp
# Opt level: O2

SHADER_RESOURCE_VARIABLE_TYPE_FLAGS __thiscall
Diligent::ShaderResourceBindingBase<Diligent::EngineGLImplTraits>::CheckResources
          (ShaderResourceBindingBase<Diligent::EngineGLImplTraits> *this,SHADER_TYPE ShaderStages,
          IResourceMapping *pResMapping,BIND_SHADER_RESOURCES_FLAGS Flags)

{
  SHADER_RESOURCE_VARIABLE_TYPE_FLAGS StaleVarTypes;
  SHADER_RESOURCE_VARIABLE_TYPE_FLAGS local_30;
  BIND_SHADER_RESOURCES_FLAGS local_2c;
  IResourceMapping *local_28;
  anon_class_24_3_cd5e4a19 local_20;
  
  local_20.pResMapping = &local_28;
  local_20.Flags = &local_2c;
  local_20.StaleVarTypes = &local_30;
  local_30 = SHADER_RESOURCE_VARIABLE_TYPE_FLAG_NONE;
  local_2c = Flags;
  local_28 = pResMapping;
  ProcessVariables<Diligent::ShaderResourceBindingBase<Diligent::EngineGLImplTraits>::CheckResources(Diligent::SHADER_TYPE,Diligent::IResourceMapping*,Diligent::BIND_SHADER_RESOURCES_FLAGS)const::_lambda(Diligent::ShaderVariableManagerGL_const&)_1_>
            (this,ShaderStages,&local_20);
  return local_30;
}

Assistant:

CheckResources(
        SHADER_TYPE                 ShaderStages,
        IResourceMapping*           pResMapping,
        BIND_SHADER_RESOURCES_FLAGS Flags) const override final
    {
        SHADER_RESOURCE_VARIABLE_TYPE_FLAGS StaleVarTypes = SHADER_RESOURCE_VARIABLE_TYPE_FLAG_NONE;
        ProcessVariables(ShaderStages,
                         [&](const ShaderVariableManagerImplType& Mgr) //
                         {
                             Mgr.CheckResources(pResMapping, Flags, StaleVarTypes);
                             // Stop when both mutable and dynamic variables are stale as there is no reason to check further.
                             return (StaleVarTypes & SHADER_RESOURCE_VARIABLE_TYPE_FLAG_MUT_DYN) != SHADER_RESOURCE_VARIABLE_TYPE_FLAG_MUT_DYN;
                         });
        return StaleVarTypes;
    }